

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O0

void pzshape::TPZShapePiram::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int *piVar9;
  double *pdVar10;
  TPZVec<int> *in_RSI;
  REAL sidescale [19];
  int isface;
  int is3_1;
  int is2_3;
  int is1_3;
  int is3;
  int is2_2;
  int is1_2;
  int is2_1;
  int is1_1;
  int is2;
  int is1;
  int is;
  undefined8 in_stack_fffffffffffffc18;
  int node;
  undefined8 in_stack_fffffffffffffc20;
  double dVar11;
  double in_stack_fffffffffffffc30;
  double in_stack_fffffffffffffc38;
  TPZFMatrix<double> *in_stack_fffffffffffffc40;
  double local_e8 [19];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  TPZVec<int> *local_10;
  
  local_10 = in_RSI;
  for (local_24 = 5; node = (int)((ulong)in_stack_fffffffffffffc18 >> 0x20), local_24 < 0xd;
      local_24 = local_24 + 1) {
    piVar9 = TPZVec<int>::operator[](local_10,(long)local_24 + -5);
    if (0 < *piVar9) {
      local_28 = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
      local_2c = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar11 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar1 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar11 * dVar1;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar11 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar1 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar2 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar3 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar11 * dVar1 + dVar2 * dVar3;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar11 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar1 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar2 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar3 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar11 * dVar1 + dVar2 * dVar3;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar11 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar1 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar2 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar3 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar11 * dVar1 + dVar2 * dVar3;
    }
  }
  local_24 = 0xd;
  local_30 = 0;
  local_34 = 2;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar11 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  *pdVar10 = dVar11 * dVar1;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar11 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar3 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  *pdVar10 = dVar11 * dVar1 + dVar2 * dVar3;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar11 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar3 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  *pdVar10 = dVar11 * dVar1 + dVar2 * dVar3;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar11 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  dVar3 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                       (int64_t)in_stack_fffffffffffffc30);
  *pdVar10 = dVar11 * dVar1 + dVar2 * dVar3;
  while (local_24 = local_24 + 1, local_24 < 0x12) {
    piVar9 = TPZVec<int>::operator[](local_10,(long)local_24 + -5);
    if (0 < *piVar9) {
      local_38 = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
      local_3c = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
      local_40 = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar11 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar1 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar2 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar11 * dVar1 * dVar2;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar11 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar1 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar2 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar3 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar4 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar5 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar6 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar7 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar8 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar6 * dVar7 * dVar8 + dVar11 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar11 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar1 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar2 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar3 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar4 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar5 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar6 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar7 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar8 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar6 * dVar7 * dVar8 + dVar11 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar11 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar1 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar2 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar3 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar4 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar5 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar6 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar7 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      dVar8 = *pdVar10;
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar6 * dVar7 * dVar8 + dVar11 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
    }
  }
  piVar9 = TPZVec<int>::operator[](local_10,0xd);
  if (0 < *piVar9) {
    local_44 = 0;
    local_48 = 2;
    local_4c = 4;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar11 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    *pdVar10 = dVar11 * dVar1 * dVar2;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar11 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar3 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar4 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar5 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar6 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar7 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar8 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    *pdVar10 = dVar6 * dVar7 * dVar8 + dVar11 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar11 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar3 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar4 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar5 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar6 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar7 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar8 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    *pdVar10 = dVar6 * dVar7 * dVar8 + dVar11 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar11 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar3 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar4 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar5 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar6 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar7 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar8 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    *pdVar10 = dVar6 * dVar7 * dVar8 + dVar11 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
  }
  for (local_24 = 5; local_24 < 9; local_24 = local_24 + 1) {
    local_50 = 0xd;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    in_stack_fffffffffffffc38 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    *pdVar10 = in_stack_fffffffffffffc38 + *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    in_stack_fffffffffffffc40 = (TPZFMatrix<double> *)*pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    *pdVar10 = (double)in_stack_fffffffffffffc40 + *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar11 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    *pdVar10 = dVar11 + *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    dVar11 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                         (int64_t)in_stack_fffffffffffffc30);
    *pdVar10 = dVar11 + *pdVar10;
  }
  memcpy(local_e8,&DAT_02097a00,0x98);
  for (local_24 = 5; local_24 < 0x13; local_24 = local_24 + 1) {
    piVar9 = TPZVec<int>::operator[](local_10,(long)local_24 + -5);
    if (0 < *piVar9) {
      dVar11 = local_e8[local_24];
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar11 * *pdVar10;
      dVar11 = local_e8[local_24];
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar11 * *pdVar10;
      dVar11 = local_e8[local_24];
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = dVar11 * *pdVar10;
      in_stack_fffffffffffffc30 = local_e8[local_24];
      pdVar10 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                           (int64_t)in_stack_fffffffffffffc30);
      *pdVar10 = in_stack_fffffffffffffc30 * *pdVar10;
    }
  }
  return;
}

Assistant:

void TPZShapePiram::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        int is;
        // contribute the ribs
        for(is=NCornerNodes; is<NCornerNodes+8; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            int is1,is2;
            is1 = ContainedSideLocId(is,0);
            is2 = ContainedSideLocId(is,1);
            phi(is,0) = phi(is1,0)*phi(is2,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
        }
        // contribution of the faces
        // quadrilateral face
        is = 13;
        {
            int is1,is2;
            is1 = ShapeFaceId[0][0];// SideConnectLocId(is,0);
            is2 = ShapeFaceId[0][2];// SideConnectLocId(is,2);
            phi(is,0) = phi(is1,0)*phi(is2,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
        }
        is++;
        // triangular faces
        for(;is<18; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            int is1,is2,is3;
            is1 = ContainedSideLocId(is,0);
            is2 = ContainedSideLocId(is,1);
            is3 = ContainedSideLocId(is,2);
            phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
            
        }
        if(nshape[NSides-NCornerNodes-1] > 0)
        {
            int is1 = 0;
            int is2 = 2;
            int is3 = 4;
            phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
        }
        
        // Make the generating shape functions linear and unitary
        // contribute the ribs
        for(is=NCornerNodes; is<NCornerNodes+4; is++)
        {
            int isface = 13;
            phi(is,0) += phi(isface,0);
            dphi(0,is) += dphi(0,isface);
            dphi(1,is) += dphi(1,isface);
            dphi(2,is) += dphi(2,isface);
        }
        // scaling the shapefunctions
        {
            REAL sidescale[] = {1.,1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,4.,4.,16.,27.,27.,27.,27.,64.};
            for(is=5; is<NSides; is++)
            {
                if(nshape[is-NCornerNodes] < 1) continue;
                phi(is,0) *= sidescale[is];
                dphi(0,is) *= sidescale[is];
                dphi(1,is) *= sidescale[is];
                dphi(2,is) *= sidescale[is];
            }
        }
        
        
    }